

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O2

void __thiscall LsuContent::LsuContent(LsuContent *this,istream *is)

{
  uint8_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  __shared_ptr<Lsa,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<RouterLsa> lsa;
  LsaHeader temp_header;
  
  (this->super_OspfContent)._vptr_OspfContent = (_func_int **)&PTR__LsuContent_0012a528;
  (this->lsas).super__Vector_base<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lsas).super__Vector_base<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lsas).super__Vector_base<std::shared_ptr<Lsa>,_std::allocator<std::shared_ptr<Lsa>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = &this->lsa_num;
  std::istream::read((char *)is,(long)puVar3);
  uVar2 = *puVar3;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  *puVar3 = uVar2;
  do {
    while( true ) {
      bVar4 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar4) {
        return;
      }
      auVar5 = std::istream::tellg();
      std::istream::read((char *)is,(long)&temp_header);
      uVar1 = temp_header.lsa_type;
      std::istream::seekg(is,auVar5._0_8_,auVar5._8_8_);
      if (uVar1 != '\x02') break;
      std::make_shared<NetworkLsa,std::istream&>
                ((basic_istream<char,_std::char_traits<char>_> *)&lsa);
      std::__shared_ptr<Lsa,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NetworkLsa,void>
                (local_68,(__shared_ptr<NetworkLsa,_(__gnu_cxx::_Lock_policy)2> *)&lsa);
      std::vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>>::
      emplace_back<std::shared_ptr<Lsa>>
                ((vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>> *)&this->lsas,
                 (shared_ptr<Lsa> *)local_68);
LAB_0011d34b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lsa.super___shared_ptr<RouterLsa,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if (uVar1 == '\x01') {
      std::make_shared<RouterLsa,std::istream&>
                ((basic_istream<char,_std::char_traits<char>_> *)&lsa);
      std::__shared_ptr<Lsa,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<RouterLsa,void>
                (local_68,(__shared_ptr<RouterLsa,_(__gnu_cxx::_Lock_policy)2> *)&lsa);
      std::vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>>::
      emplace_back<std::shared_ptr<Lsa>>
                ((vector<std::shared_ptr<Lsa>,std::allocator<std::shared_ptr<Lsa>>> *)&this->lsas,
                 (shared_ptr<Lsa> *)local_68);
      goto LAB_0011d34b;
    }
    std::istream::seekg((long)is,(uint)temp_header.tlen);
  } while( true );
}

Assistant:

LsuContent::LsuContent(std::istream& is)
{
    is.read((char*)&lsa_num, 4);
    lsa_num      = ntohl(lsa_num);
    uint32_t num = lsa_num;
    while (num != 0)
    {
        //取得lsa的type并将istream恢复位置
        LsaHeader temp_header;
        auto      pos = is.tellg();
        is.read((char*)&temp_header, sizeof(LsaHeader));
        uint8_t lsa_type = temp_header.lsa_type;
        is.seekg(pos);

        //根据type创建不同的lsa
        if (lsa_type == 1)  // router-lsa
        {
            auto lsa = std::make_shared<RouterLsa>(is);
            lsas.push_back(lsa);
        }
        else if (lsa_type == 2)  // network-lsa
        {
            auto lsa = std::make_shared<NetworkLsa>(is);
            lsas.push_back(lsa);
        }
        else  //其他lsa跳过 TODO
        {
            // std::cout << "ignore other lsa -- type: " << (uint16_t)lsa_type
            // << '\n';
            is.seekg(temp_header.tlen, std::ios::cur);
        }

        --num;
    }
}